

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Dictionary.cc
# Opt level: O2

bool __thiscall QPDFObjectHandle::hasKey(QPDFObjectHandle *this,string *key)

{
  bool bVar1;
  Dictionary dict;
  allocator<char> local_49;
  QPDFObjectHandle local_48;
  string local_38;
  
  as_dictionary(&local_48,(typed)this);
  if (local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"returning false for a key containment request",&local_49);
    typeWarning(this,"dictionary",&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    bVar1 = false;
  }
  else {
    bVar1 = ::qpdf::BaseDictionary::hasKey((BaseDictionary *)&local_48,key);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return bVar1;
}

Assistant:

bool
QPDFObjectHandle::hasKey(std::string const& key) const
{
    auto dict = as_dictionary(strict);
    if (dict) {
        return dict.hasKey(key);
    } else {
        typeWarning("dictionary", "returning false for a key containment request");
        QTC::TC("qpdf", "QPDFObjectHandle dictionary false for hasKey");
        return false;
    }
}